

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error asmjit::BaseBuilder_newLabelInternal(BaseBuilder *self,uint32_t labelId)

{
  ZoneVector<asmjit::LabelNode_*> *this;
  uint uVar1;
  CodeHolder *this_00;
  Error EVar2;
  Error extraout_EAX;
  size_t nameSize;
  char *name;
  uint n;
  undefined4 uVar3;
  BaseBuilder *self_00;
  ZoneVector<asmjit::LabelNode_*> *pZVar4;
  uint32_t in_R8D;
  uint32_t in_R9D;
  undefined8 *unaff_R13;
  BaseBuilder *unaff_R14;
  LabelEntry *pLStack_58;
  ulong uStack_50;
  BaseBuilder *pBStack_48;
  code *pcStack_40;
  size_t sStack_38;
  
  uVar1 = (self->_labelNodes).super_ZoneVectorBase._size;
  n = labelId + 1;
  if (n <= uVar1) {
    pcStack_40 = (code *)0x112ab1;
    BaseBuilder_newLabelInternal();
    EVar2 = extraout_EAX;
LAB_00112ab1:
    EVar2 = BaseEmitter::reportError(&unaff_R14->super_BaseEmitter,EVar2,(char *)0x0);
    return EVar2;
  }
  this = &self->_labelNodes;
  self_00 = (BaseBuilder *)&self->_allocator;
  if ((self->_labelNodes).super_ZoneVectorBase._capacity - uVar1 < labelId - uVar1) {
    pcStack_40 = (code *)0x112a1c;
    EVar2 = ZoneVectorBase::_grow
                      (&this->super_ZoneVectorBase,(ZoneAllocator *)self_00,8,labelId - uVar1);
    unaff_R14 = self;
    if (EVar2 != 0) goto LAB_00112ab1;
  }
  if (((ZoneAllocator *)self_00)->_zone == (Zone *)0x0) {
    pcStack_40 = (code *)0x112ad0;
    BaseBuilder_newLabelInternal();
  }
  else {
    pcStack_40 = (code *)0x112a3f;
    unaff_R13 = (undefined8 *)ZoneAllocator::_alloc((ZoneAllocator *)self_00,0x38,&sStack_38);
    if (unaff_R13 != (undefined8 *)0x0) {
      *unaff_R13 = 0;
      unaff_R13[1] = 0;
      *(undefined1 *)(unaff_R13 + 2) = 3;
      *(byte *)((long)unaff_R13 + 0x11) = (byte)self->_nodeFlags | 0x50;
      *(undefined8 *)((long)unaff_R13 + 0x12) = 0;
      *(undefined8 *)((long)unaff_R13 + 0x1a) = 0;
      unaff_R13[4] = 0;
      unaff_R13[5] = 0;
      *(uint32_t *)(unaff_R13 + 6) = labelId;
      goto LAB_00112a73;
    }
  }
  pcStack_40 = (code *)0x112adf;
  EVar2 = BaseEmitter::reportError(&self->super_BaseEmitter,1,(char *)0x0);
  if (EVar2 != 0) {
    return EVar2;
  }
LAB_00112a73:
  nameSize = (size_t)n;
  pcStack_40 = (code *)0x112a85;
  pZVar4 = this;
  ZoneVectorBase::_resize(&this->super_ZoneVectorBase,(ZoneAllocator *)self_00,8,n);
  if (labelId < (self->_labelNodes).super_ZoneVectorBase._size) {
    *(undefined8 **)((long)(this->super_ZoneVectorBase)._data + (ulong)labelId * 8) = unaff_R13;
    *(uint32_t *)(unaff_R13 + 6) = labelId;
    return 0;
  }
  pcStack_40 = BaseBuilder::newNamedLabel;
  BaseBuilder_newLabelInternal();
  this_00 = (self_00->super_BaseEmitter)._code;
  uVar3 = 0xffffffff;
  if (((this_00 != (CodeHolder *)0x0) &&
      (uStack_50 = (ulong)labelId, pBStack_48 = self, pcStack_40 = (code *)(ulong)n,
      EVar2 = CodeHolder::newNamedLabelEntry(this_00,&pLStack_58,name,nameSize,in_R8D,in_R9D),
      EVar2 == 0)) &&
     (EVar2 = BaseBuilder_newLabelInternal(self_00,*(uint32_t *)&pLStack_58->field_0xc), EVar2 == 0)
     ) {
    uVar3 = *(undefined4 *)&pLStack_58->field_0xc;
  }
  *(undefined4 *)&(pZVar4->super_ZoneVectorBase)._data = 4;
  *(undefined4 *)((long)&(pZVar4->super_ZoneVectorBase)._data + 4) = uVar3;
  (pZVar4->super_ZoneVectorBase)._size = 0;
  (pZVar4->super_ZoneVectorBase)._capacity = 0;
  return (Error)pZVar4;
}

Assistant:

static Error BaseBuilder_newLabelInternal(BaseBuilder* self, uint32_t labelId) {
  ASMJIT_ASSERT(self->_labelNodes.size() < labelId + 1);

  uint32_t growBy = labelId - self->_labelNodes.size();
  Error err = self->_labelNodes.willGrow(&self->_allocator, growBy);

  if (ASMJIT_UNLIKELY(err))
    return self->reportError(err);

  LabelNode* node;
  ASMJIT_PROPAGATE(self->_newNodeT<LabelNode>(&node, labelId));

  self->_labelNodes.resize(&self->_allocator, labelId + 1);
  self->_labelNodes[labelId] = node;
  node->_labelId = labelId;
  return kErrorOk;
}